

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateYield(ExpressionTranslateContext *ctx,ExprYield *expression)

{
  ExprBase *expression_00;
  ExprBase *expression_01;
  char *format;
  
  if (expression->coroutineStateUpdate != (ExprBase *)0x0) {
    Translate(ctx,expression->coroutineStateUpdate);
    Print(ctx,";");
    OutputContext::Print(ctx->output,"\n",1);
    PrintIndent(ctx);
  }
  expression_00 = expression->closures;
  if ((expression_00 == (ExprBase *)0x0) || (expression_00->typeID != 0x37)) {
    expression_01 = expression->value;
    if (expression_01->type != ctx->ctx->typeVoid) goto LAB_00258bff;
LAB_00258c61:
    Translate(ctx,expression_01);
    Print(ctx,";");
    OutputContext::Print(ctx->output,"\n",1);
    PrintIndent(ctx);
    format = "return;";
  }
  else {
    expression_01 = expression->value;
    if (expression_01->type == ctx->ctx->typeVoid) {
      if (expression_00[1].typeID != 0) {
        Translate(ctx,expression_00);
        Print(ctx,";");
        OutputContext::Print(ctx->output,"\n",1);
        PrintIndent(ctx);
        expression_01 = expression->value;
      }
      goto LAB_00258c61;
    }
    if (expression_00[1].typeID != 0) {
      Print(ctx,"__nullcReturnValue_%d = ",(ulong)ctx->nextReturnValueId);
      Translate(ctx,expression->value);
      Print(ctx,";");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      Translate(ctx,expression->closures);
      Print(ctx,";");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      Print(ctx,"return __nullcReturnValue_%d;",(ulong)ctx->nextReturnValueId);
      goto LAB_00258cab;
    }
LAB_00258bff:
    Print(ctx,"return ");
    Translate(ctx,expression->value);
    format = ";";
  }
  Print(ctx,format);
LAB_00258cab:
  OutputContext::Print(ctx->output,"\n",1);
  ctx->currentFunction->nextTranslateRestoreBlock =
       ctx->currentFunction->nextTranslateRestoreBlock + 1;
  Print(ctx,"yield_%d:");
  return;
}

Assistant:

void TranslateYield(ExpressionTranslateContext &ctx, ExprYield *expression)
{
	if(expression->coroutineStateUpdate)
	{
		Translate(ctx, expression->coroutineStateUpdate);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);
	}

	ExprSequence *closures = getType<ExprSequence>(expression->closures);

	if(closures && closures->expressions.empty())
		closures = NULL;

	if(expression->value->type == ctx.ctx.typeVoid)
	{
		if(closures)
		{
			Translate(ctx, expression->closures);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);
		}

		Translate(ctx, expression->value);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);

		Print(ctx, "return;");
	}
	else if(closures)
	{
		Print(ctx, "__nullcReturnValue_%d = ", ctx.nextReturnValueId);
		Translate(ctx, expression->value);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);

		Translate(ctx, expression->closures);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);

		Print(ctx, "return __nullcReturnValue_%d;", ctx.nextReturnValueId);
	}
	else
	{
		Print(ctx, "return ");
		Translate(ctx, expression->value);
		Print(ctx, ";");
	}

	PrintLine(ctx);

	Print(ctx, "yield_%d:", ctx.currentFunction->nextTranslateRestoreBlock++);
}